

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O2

void __thiscall
Object_ValueAlignment_Test<wchar_t>::TestBody(Object_ValueAlignment_Test<wchar_t> *this)

{
  allocator_type *__a;
  void *__buf;
  char *message;
  long lVar1;
  initializer_list<pstore::dump::object::member> __l;
  int in_stack_fffffffffffffe9c;
  allocator_type local_15b;
  allocator local_15a;
  allocator local_159;
  value_ptr local_158;
  AssertionResult gtest_ar;
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_128;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> expected;
  object local_f0;
  element_type *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  value_ptr local_b8;
  element_type *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_a0 [2];
  __string_type actual;
  member local_60;
  
  std::__cxx11::string::string((string *)&expected,"short",&local_159);
  pstore::dump::make_number(in_stack_fffffffffffffe9c);
  local_158.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_a8;
  local_158.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_a0[0]._M_pi;
  local_a8 = (element_type *)0x0;
  a_Stack_a0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pstore::dump::object::member::member((member *)&actual,(string *)&expected,&local_158);
  std::__cxx11::string::string((string *)&gtest_ar,"much_longer",&local_15a);
  pstore::dump::make_number(in_stack_fffffffffffffe9c);
  local_b8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_c8;
  local_b8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_c0._M_pi;
  local_c8 = (element_type *)0x0;
  _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pstore::dump::object::member::member(&local_60,(string *)&gtest_ar,&local_b8);
  __a = &local_15b;
  __l._M_len = 2;
  __l._M_array = (iterator)&actual;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
            (&local_128,__l,__a);
  local_f0.super_value._vptr_value = (_func_int **)&PTR__object_001dab90;
  local_f0.members_.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_128.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_f0.members_.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_128.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_f0.members_.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_128.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_128.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0.compact_ = false;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            (&local_128);
  lVar1 = 0x30;
  do {
    pstore::dump::object::member::~member((member *)((long)&actual._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_c0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_158.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_a0);
  std::__cxx11::string::~string((string *)&expected);
  pstore::dump::value::write(&local_f0.super_value,(int)this + 0x10,__buf,(size_t)__a);
  std::__cxx11::wstringbuf::str();
  convert<wchar_t>(&expected,"short       : 0x2a\nmuch_longer : 0x2b");
  testing::internal::CmpHelperEQ<std::__cxx11::wstring,std::__cxx11::wstring>
            ((internal *)&gtest_ar,"expected","actual",&expected,&actual);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_128);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/dump/test_object.cpp"
               ,0x83,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    if (local_128.
        super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(((local_128.
                     super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
                     ._M_impl.super__Vector_impl_data._M_start)->property)._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::wstring::~wstring((wstring *)&expected);
  std::__cxx11::wstring::~wstring((wstring *)&actual);
  pstore::dump::object::~object(&local_f0);
  return;
}

Assistant:

TYPED_TEST (Object, ValueAlignment) {
    using namespace ::pstore::dump;
    object v{{
        {"short", make_number (42)},
        {"much_longer", make_number (43)},
    }};
    v.write (this->out);
    auto const actual = this->out.str ();
    auto const expected = convert<TypeParam> ("short       : 0x2a\n"
                                              "much_longer : 0x2b");
    EXPECT_EQ (expected, actual);
}